

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::BeginRenderPass
          (DeviceContextGLImpl *this,BeginRenderPassAttribs *Attribs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pOVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  char *in_RCX;
  string msg;
  string local_38;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::BeginRenderPass
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs);
  std::vector<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>::resize
            (&this->m_AttachmentClearValues,(ulong)Attribs->ClearValueCount);
  if (Attribs->ClearValueCount != 0) {
    lVar7 = 0;
    in_RCX = (char *)0x0;
    do {
      pOVar3 = (this->m_AttachmentClearValues).
               super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)Attribs->pClearValues->Color + lVar7 + -4);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)Attribs->pClearValues->Color + lVar7 + 8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)pOVar3->Color + lVar7 + 8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)pOVar3->Color + lVar7 + -4);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      in_RCX = *(char (*) [20])in_RCX + 1;
      lVar7 = lVar7 + 0x1c;
    } while (in_RCX < (char *)(ulong)Attribs->ClearValueCount);
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.m_pObject ==
      (FramebufferGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",(char (*) [20])in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x28d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  SetViewports(this,1,(Viewport *)0x0,0,0);
  BeginSubpass(this);
  return;
}

Assistant:

void DeviceContextGLImpl::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    TDeviceContextBase::BeginRenderPass(Attribs);

    m_AttachmentClearValues.resize(Attribs.ClearValueCount);
    for (Uint32 i = 0; i < Attribs.ClearValueCount; ++i)
        m_AttachmentClearValues[i] = Attribs.pClearValues[i];

    VERIFY_EXPR(m_pBoundFramebuffer);

    SetViewports(1, nullptr, 0, 0);

    BeginSubpass();
}